

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O3

CURLcode Curl_pp_statemach(pingpong *pp,_Bool block)

{
  curl_socket_t cVar1;
  connectdata *conn;
  SessionHandle *data;
  int iVar2;
  int iVar3;
  CURLcode CVar4;
  ulong uVar5;
  curl_socket_t writefd;
  ulong uVar6;
  curl_socket_t readfd0;
  timeval now;
  
  conn = pp->conn;
  cVar1 = conn->sock[0];
  uVar5 = Curl_pp_state_timeout(pp);
  data = conn->data;
  if ((long)uVar5 < 1) {
    Curl_failf(data,"server response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  uVar6 = 1000;
  if (uVar5 < 1000) {
    uVar6 = uVar5;
  }
  uVar5 = 0;
  if (block) {
    uVar5 = uVar6;
  }
  if (pp->sendleft == 0) {
    writefd = -1;
    readfd0 = cVar1;
    if ((pp->cache != (char *)0x0) && (iVar2 = 1, pp->nread_resp < pp->cache_size))
    goto LAB_0048f2a5;
  }
  else {
    readfd0 = -1;
    writefd = cVar1;
  }
  iVar2 = Curl_socket_check(readfd0,-1,writefd,uVar5);
LAB_0048f2a5:
  if (block) {
    iVar3 = Curl_pgrsUpdate(conn);
    if (iVar3 != 0) {
      return CURLE_ABORTED_BY_CALLBACK;
    }
    now = curlx_tvnow();
    CVar4 = Curl_speedcheck(data,now);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
  }
  if (iVar2 == 0) {
    CVar4 = CURLE_OK;
  }
  else {
    if (iVar2 != -1) {
      CVar4 = (*pp->statemach_act)(conn);
      return CVar4;
    }
    Curl_failf(data,"select/poll error");
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_pp_statemach(struct pingpong *pp, bool block)
{
  struct connectdata *conn = pp->conn;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int rc;
  long interval_ms;
  long timeout_ms = Curl_pp_state_timeout(pp);
  struct SessionHandle *data=conn->data;
  CURLcode result = CURLE_OK;

  if(timeout_ms <=0 ) {
    failf(data, "server response timeout");
    return CURLE_OPERATION_TIMEDOUT; /* already too little time */
  }

  if(block) {
    interval_ms = 1000;  /* use 1 second timeout intervals */
    if(timeout_ms < interval_ms)
      interval_ms = timeout_ms;
  }
  else
    interval_ms = 0; /* immediate */

  if(Curl_pp_moredata(pp))
    /* We are receiving and there is data in the cache so just read it */
    rc = 1;
  else if(!pp->sendleft && Curl_ssl_data_pending(conn, FIRSTSOCKET))
    /* We are receiving and there is data ready in the SSL library */
    rc = 1;
  else
    rc = Curl_socket_ready(pp->sendleft?CURL_SOCKET_BAD:sock, /* reading */
                           pp->sendleft?sock:CURL_SOCKET_BAD, /* writing */
                           interval_ms);

  if(block) {
    /* if we didn't wait, we don't have to spend time on this now */
    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_tvnow());

    if(result)
      return result;
  }

  if(rc == -1) {
    failf(data, "select/poll error");
    result = CURLE_OUT_OF_MEMORY;
  }
  else if(rc)
    result = pp->statemach_act(conn);

  return result;
}